

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::hufDecode(longlong *hcode,HufDec *hdecod,char *in,int ni,int rlc,int no,
                       unsigned_short *out)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  unsigned_short *puVar7;
  byte *pbVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  unsigned_short *puVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  unsigned_short *puVar17;
  char cVar18;
  unsigned_short *outb;
  
  puVar1 = out + no;
  iVar6 = ni + 0xe;
  if (-1 < ni + 7) {
    iVar6 = ni + 7;
  }
  puVar7 = out;
  if (ni < 1) {
    iVar6 = 0;
    uVar16 = 0;
  }
  else {
    pbVar8 = (byte *)(in + (iVar6 >> 3));
    uVar16 = 0;
    iVar6 = 0;
    do {
      bVar13 = *in;
      in = (char *)((byte *)in + 1);
      uVar16 = uVar16 << 8 | (ulong)bVar13;
      iVar6 = iVar6 + 8;
      while (0xd < iVar6) {
        uVar15 = (ulong)(((uint)((long)uVar16 >> ((char)iVar6 - 0xeU & 0x3f)) & 0x3fff) << 4);
        iVar3 = *(int *)(&hdecod->field_0x0 + uVar15);
        uVar10 = iVar3 >> 8;
        if (iVar3 << 0x18 == 0) {
          lVar4 = *(long *)((long)&hdecod->p + uVar15);
          uVar11 = 0;
          if (lVar4 != 0) {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                iVar3 = *(int *)(lVar4 + uVar15 * 4);
                uVar11 = (uint)hcode[iVar3] & 0x3f;
                for (; (iVar6 < (int)uVar11 && (in < pbVar8)); in = (char *)((byte *)in + 1)) {
                  uVar16 = (ulong)(byte)*in | uVar16 << 8;
                  iVar6 = iVar6 + 8;
                }
                cVar18 = '\0';
                if (((int)uVar11 <= iVar6) &&
                   (iVar14 = iVar6 - uVar11, cVar18 = '\0',
                   hcode[iVar3] >> 6 ==
                   (~(-1L << (sbyte)uVar11) & (long)uVar16 >> ((byte)iVar14 & 0x3f)))) {
                  if (iVar3 == rlc) {
                    if (iVar14 < 8) {
                      bVar13 = *in;
                      in = (char *)((byte *)in + 1);
                      uVar16 = uVar16 << 8 | (ulong)bVar13;
                      iVar14 = iVar14 + 8;
                    }
                    iVar6 = iVar14 + -8;
                    uVar9 = (long)uVar16 >> ((byte)iVar6 & 0x3f);
                    cVar18 = '\x01';
                    if ((puVar7 + (uVar9 & 0xff) <= puVar1) && (cVar18 = '\b', (char)uVar9 != '\0'))
                    {
                      uVar2 = puVar7[-1];
                      do {
                        *puVar7 = uVar2;
                        puVar7 = puVar7 + 1;
                        bVar13 = (char)uVar9 - 1;
                        uVar9 = (ulong)bVar13;
                      } while (bVar13 != 0);
                    }
                  }
                  else {
                    cVar18 = '\x01';
                    iVar6 = iVar14;
                    if (puVar7 < puVar1) {
                      *puVar7 = (unsigned_short)iVar3;
                      puVar7 = puVar7 + 1;
                      cVar18 = '\b';
                    }
                  }
                }
                if (cVar18 != '\0') {
                  if (cVar18 != '\b') goto LAB_0012642f;
                  goto LAB_00126411;
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar10);
              uVar15 = (ulong)uVar10;
LAB_00126411:
              uVar11 = (uint)uVar15;
            }
            cVar18 = uVar11 == uVar10;
LAB_0012642f:
            if (cVar18 == '\0') goto LAB_0012643f;
          }
LAB_00126437:
          bVar5 = false;
        }
        else {
          iVar6 = iVar6 - ((iVar3 << 0x18) >> 0x18);
          if (uVar10 == rlc) {
            if (iVar6 < 8) {
              bVar13 = *in;
              in = (char *)((byte *)in + 1);
              uVar16 = uVar16 << 8 | (ulong)bVar13;
              iVar6 = iVar6 + 8;
            }
            iVar6 = iVar6 + -8;
            uVar15 = (long)uVar16 >> ((byte)iVar6 & 0x3f);
            puVar12 = puVar7 + (uVar15 & 0xff);
            if ((puVar12 <= puVar1) && ((char)uVar15 != '\0')) {
              uVar2 = puVar7[-1];
              puVar17 = puVar7;
              do {
                puVar7 = puVar17 + 1;
                *puVar17 = uVar2;
                bVar13 = (char)uVar15 - 1;
                uVar15 = (ulong)bVar13;
                puVar17 = puVar7;
              } while (bVar13 != 0);
            }
            if (puVar1 < puVar12) {
              bVar5 = false;
              goto LAB_00126442;
            }
          }
          else {
            if (puVar1 <= puVar7) goto LAB_00126437;
            *puVar7 = (unsigned_short)((uint)iVar3 >> 8);
            puVar7 = puVar7 + 1;
          }
LAB_0012643f:
          bVar5 = true;
        }
LAB_00126442:
        if (!bVar5) {
          return false;
        }
      }
    } while (in < pbVar8);
  }
  uVar16 = (long)uVar16 >> (sbyte)(-ni & 7U);
  iVar6 = iVar6 - (-ni & 7U);
  do {
    if (iVar6 < 1) {
      return (long)puVar7 - (long)out >> 1 == (long)no;
    }
    iVar3 = *(int *)(&hdecod->field_0x0 +
                    (((uint)(uVar16 << (0xeU - (char)iVar6 & 0x3f)) & 0x3fff) << 4));
    if (iVar3 << 0x18 == 0) {
LAB_0012650b:
      bVar5 = false;
    }
    else {
      iVar6 = iVar6 - ((iVar3 << 0x18) >> 0x18);
      if (iVar3 >> 8 == rlc) {
        if (iVar6 < 8) {
          bVar13 = *in;
          in = (char *)((byte *)in + 1);
          uVar16 = uVar16 << 8 | (ulong)bVar13;
          iVar6 = iVar6 + 8;
        }
        iVar6 = iVar6 + -8;
        uVar15 = (long)uVar16 >> ((byte)iVar6 & 0x3f);
        bVar5 = puVar7 + (uVar15 & 0xff) <= puVar1;
        if ((puVar7 + (uVar15 & 0xff) <= puVar1) && ((char)uVar15 != '\0')) {
          uVar2 = puVar7[-1];
          do {
            *puVar7 = uVar2;
            puVar7 = puVar7 + 1;
            bVar13 = (char)uVar15 - 1;
            uVar15 = (ulong)bVar13;
          } while (bVar13 != 0);
        }
      }
      else {
        if (puVar1 <= puVar7) goto LAB_0012650b;
        *puVar7 = (unsigned_short)((uint)iVar3 >> 8);
        puVar7 = puVar7 + 1;
        bVar5 = true;
      }
    }
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool hufDecode(const long long *hcode,  // i : encoding table
               const HufDec *hdecod,    // i : decoding table
               const char *in,          // i : compressed input buffer
               int ni,                  // i : input size (in bits)
               int rlc,                 // i : run-length code
               int no,                  // i : expected output size (in bytes)
               unsigned short *out)     //  o: uncompressed output buffer
{
  long long c = 0;
  int lc = 0;
  unsigned short *outb = out;
  unsigned short *oe = out + no;
  const char *ie = in + (ni + 7) / 8;  // input byte size

  //
  // Loop on input bytes
  //

  while (in < ie) {
    getChar(c, lc, in);

    //
    // Access decoding table
    //

    while (lc >= HUF_DECBITS) {
      const HufDec pl = hdecod[(c >> (lc - HUF_DECBITS)) & HUF_DECMASK];

      if (pl.len) {
        //
        // Get short code
        //

        lc -= pl.len;
        getCode(pl.lit, rlc, c, lc, in, out, oe);
      } else {
        if (!pl.p) {
          return false;
        }
        // invalidCode(); // wrong code

        //
        // Search long code
        //

        int j;

        for (j = 0; j < pl.lit; j++) {
          int l = hufLength(hcode[pl.p[j]]);

          while (lc < l && in < ie)  // get more bits
            getChar(c, lc, in);

          if (lc >= l) {
            if (hufCode(hcode[pl.p[j]]) ==
                ((c >> (lc - l)) & (((long long)(1) << l) - 1))) {
              //
              // Found : get long code
              //

              lc -= l;
              getCode(pl.p[j], rlc, c, lc, in, out, oe);
              break;
            }
          }
        }

        if (j == pl.lit) {
          return false;
          // invalidCode(); // Not found
        }
      }
    }
  }

  //
  // Get remaining (short) codes
  //

  int i = (8 - ni) & 7;
  c >>= i;
  lc -= i;

  while (lc > 0) {
    const HufDec pl = hdecod[(c << (HUF_DECBITS - lc)) & HUF_DECMASK];

    if (pl.len) {
      lc -= pl.len;
      getCode(pl.lit, rlc, c, lc, in, out, oe);
    } else {
      return false;
      // invalidCode(); // wrong (long) code
    }
  }

  if (out - outb != no) {
    return false;
  }
  // notEnoughData ();

  return true;
}